

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  JumpStatementSyntax *pJVar1;
  Token *args_3;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000058;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000060;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  NamedLabelSyntax *in_stack_ffffffffffffffb0;
  NamedLabelSyntax *local_48;
  
  if (*(long *)(__fn + 0x18) == 0) {
    local_48 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_48 = deepClone<slang::syntax::NamedLabelSyntax>
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000060,in_stack_00000058);
  TVar2 = parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  args_3 = (Token *)TVar2.info;
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  pJVar1 = BumpAllocator::
           emplace<slang::syntax::JumpStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     (unaff_retaddr,(NamedLabelSyntax **)__fn,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__child_stack,
                      (Token *)local_48,args_3);
  return (int)pJVar1;
}

Assistant:

static SyntaxNode* clone(const JumpStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<JumpStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.breakOrContinue.deepClone(alloc),
        node.semi.deepClone(alloc)
    );
}